

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTetrahedronShape.cpp
# Opt level: O1

void __thiscall
btBU_Simplex1to4::btBU_Simplex1to4
          (btBU_Simplex1to4 *this,btVector3 *pt0,btVector3 *pt1,btVector3 *pt2)

{
  int iVar1;
  undefined8 uVar2;
  
  btPolyhedralConvexAabbCachingShape::btPolyhedralConvexAabbCachingShape
            (&this->super_btPolyhedralConvexAabbCachingShape);
  (this->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
  super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape =
       (_func_int **)&PTR__btPolyhedralConvexShape_00226a98;
  (this->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
  super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.m_shapeType = 2;
  *(undefined4 *)&(this->super_btPolyhedralConvexAabbCachingShape).field_0x74 = 1;
  uVar2 = *(undefined8 *)(pt0->m_floats + 2);
  *(undefined8 *)this->m_vertices[0].m_floats = *(undefined8 *)pt0->m_floats;
  *(undefined8 *)(this->m_vertices[0].m_floats + 2) = uVar2;
  btPolyhedralConvexAabbCachingShape::recalcLocalAabb
            (&this->super_btPolyhedralConvexAabbCachingShape);
  iVar1 = *(int *)&(this->super_btPolyhedralConvexAabbCachingShape).field_0x74;
  *(int *)&(this->super_btPolyhedralConvexAabbCachingShape).field_0x74 = iVar1 + 1;
  uVar2 = *(undefined8 *)(pt1->m_floats + 2);
  *(undefined8 *)this->m_vertices[iVar1].m_floats = *(undefined8 *)pt1->m_floats;
  *(undefined8 *)(this->m_vertices[iVar1].m_floats + 2) = uVar2;
  btPolyhedralConvexAabbCachingShape::recalcLocalAabb
            (&this->super_btPolyhedralConvexAabbCachingShape);
  iVar1 = *(int *)&(this->super_btPolyhedralConvexAabbCachingShape).field_0x74;
  *(int *)&(this->super_btPolyhedralConvexAabbCachingShape).field_0x74 = iVar1 + 1;
  uVar2 = *(undefined8 *)(pt2->m_floats + 2);
  *(undefined8 *)this->m_vertices[iVar1].m_floats = *(undefined8 *)pt2->m_floats;
  *(undefined8 *)(this->m_vertices[iVar1].m_floats + 2) = uVar2;
  btPolyhedralConvexAabbCachingShape::recalcLocalAabb
            (&this->super_btPolyhedralConvexAabbCachingShape);
  return;
}

Assistant:

btBU_Simplex1to4::btBU_Simplex1to4(const btVector3& pt0,const btVector3& pt1,const btVector3& pt2) : btPolyhedralConvexAabbCachingShape (),
m_numVertices(0)
{
	m_shapeType = TETRAHEDRAL_SHAPE_PROXYTYPE;
	addVertex(pt0);
	addVertex(pt1);
	addVertex(pt2);
}